

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::EncryptionWithColumnKey::read
          (EncryptionWithColumnKey *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  ulong __n;
  int16_t fid;
  uint32_t _size128;
  TType ftype;
  ulong local_70;
  EncryptionWithColumnKey *local_68;
  string *local_60;
  TType _etype131;
  string fname;
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_01->_vptr_TProtocol[0x19])(this_01,&fname);
  local_60 = &this->key_metadata;
  this_00 = &this->path_in_schema;
  local_70 = 0;
  local_68 = this;
  do {
    iVar2 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&fname,&ftype,&fid);
    iVar2 = iVar2 + iVar1;
    if (ftype == T_STOP) {
      iVar1 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if ((local_70 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fname);
        this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar1 + iVar2);
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar5[1] = puVar5 + 3;
      puVar5[2] = 0;
      *(undefined1 *)(puVar5 + 3) = 0;
      *puVar5 = &PTR__TException_027d9f90;
      *(undefined4 *)(puVar5 + 5) = 1;
      __cxa_throw(puVar5,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (fid == 2) {
      if (ftype != T_STRING) {
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_01ee6b79;
      }
      iVar3 = (*this_01->_vptr_TProtocol[0x2b])(this_01,local_60);
      iVar3 = iVar3 + iVar2;
      local_68->__isset = (_EncryptionWithColumnKey__isset)((byte)local_68->__isset | 1);
    }
    else {
      if (fid == 1) {
        if (ftype == T_LIST) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this_00->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
          iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype131,&_size128);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,(ulong)_size128);
          iVar3 = iVar3 + iVar2;
          for (__n = 0; __n < _size128; __n = __n + 1) {
            pvVar4 = duckdb::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::get<true>(this_00,__n);
            iVar1 = (*this_01->_vptr_TProtocol[0x2a])(this_01,pvVar4);
            iVar3 = iVar3 + iVar1;
          }
          iVar1 = (*this_01->_vptr_TProtocol[0x20])(this_01);
          iVar3 = iVar1 + iVar3;
          local_70 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),1);
          goto LAB_01ee6b7e;
        }
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
      else {
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
LAB_01ee6b79:
      iVar3 = iVar3 + iVar2;
    }
LAB_01ee6b7e:
    iVar1 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar1 = iVar1 + iVar3;
  } while( true );
}

Assistant:

uint32_t EncryptionWithColumnKey::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_path_in_schema = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->path_in_schema.clear();
            uint32_t _size128;
            ::apache::thrift::protocol::TType _etype131;
            xfer += iprot->readListBegin(_etype131, _size128);
            this->path_in_schema.resize(_size128);
            uint32_t _i132;
            for (_i132 = 0; _i132 < _size128; ++_i132)
            {
              xfer += iprot->readString(this->path_in_schema[_i132]);
            }
            xfer += iprot->readListEnd();
          }
          isset_path_in_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->key_metadata);
          this->__isset.key_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_path_in_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}